

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_pool_2d_back(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  void *pvVar13;
  size_t __n;
  long lVar14;
  int *in_RSI;
  int *in_RDI;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  int j_2;
  int kx_1;
  void *drow_1;
  int ky_1;
  float grad;
  int j;
  void *drow;
  float val;
  int j_1;
  int kx;
  void *drowf;
  int ky;
  int kymax;
  int kxmax;
  float maxval;
  int iy;
  int ix;
  float grad0;
  int ox;
  float *srow;
  int oy;
  int offset1;
  int offset0;
  int ka;
  float *splane;
  int64_t pa;
  int64_t py;
  int64_t px;
  char *data_end;
  char *cdataf;
  char *cdata;
  int p1;
  int p0;
  int s1;
  int s0;
  int k1;
  int k0;
  ggml_op_pool op;
  int32_t *opts;
  ggml_tensor *dstf;
  ggml_tensor *src;
  float local_15c;
  int local_11c;
  int local_110;
  int local_c4;
  int local_b8;
  int local_b4;
  int local_b0;
  float local_ac;
  int local_9c;
  int local_90;
  long local_80;
  long local_58;
  void *local_50;
  
  lVar14 = *(long *)(in_RSI + 0x26);
  if (*in_RDI == 0) {
    iVar1 = in_RSI[0x15];
    iVar2 = in_RSI[0x16];
    iVar3 = in_RSI[0x17];
    iVar4 = in_RSI[0x18];
    iVar5 = in_RSI[0x19];
    iVar6 = in_RSI[0x1a];
    iVar7 = in_RSI[0x1b];
    local_50 = *(void **)(in_RSI + 0x3e);
    local_58 = *(long *)(*(long *)(in_RSI + 0x28) + 0xf8);
    lVar12 = ggml_nbytes(in_RSI);
    pvVar13 = (void *)((long)local_50 + lVar12);
    if (*in_RDI != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x190c,"GGML_ASSERT(%s) failed","params->ith == 0");
    }
    __n = ggml_nbytes(in_RSI);
    memset(local_50,0,__n);
    lVar12 = *(long *)(lVar14 + 0x10);
    lVar8 = *(long *)(lVar14 + 0x18);
    local_80 = *(long *)(lVar14 + 0xf8);
    for (; local_50 < pvVar13; local_50 = (void *)(*(long *)(in_RSI + 0x10) + (long)local_50)) {
      for (local_90 = 0; local_90 < lVar8; local_90 = local_90 + 1) {
        for (local_9c = 0; local_9c < lVar12; local_9c = local_9c + 1) {
          fVar16 = *(float *)(local_80 + local_90 * lVar12 * 4 + (long)local_9c * 4);
          iVar9 = local_9c * iVar4 - iVar6;
          iVar10 = local_90 * iVar5 - iVar7;
          if (iVar1 == 0) {
            local_ac = -3.4028235e+38;
            local_b0 = -1;
            local_b4 = -1;
            for (local_b8 = 0; local_b8 < iVar3; local_b8 = local_b8 + 1) {
              if ((-1 < iVar10 + local_b8) && ((long)(iVar10 + local_b8) < *(long *)(in_RSI + 6))) {
                lVar14 = local_58 + *(long *)(in_RSI + 0xe) * (long)(iVar10 + local_b8);
                for (local_c4 = 0; local_c4 < iVar2; local_c4 = local_c4 + 1) {
                  iVar11 = iVar9 + local_c4;
                  if ((-1 < iVar11) && ((long)iVar11 < *(long *)(in_RSI + 4))) {
                    if (*in_RSI == 0) {
                      local_15c = *(float *)(lVar14 + (long)iVar11 * 4);
                    }
                    else {
                      local_15c = ggml_lookup_fp16_to_fp32
                                            (*(ggml_fp16_t *)(lVar14 + (long)iVar11 * 2));
                    }
                    if (local_ac < local_15c) {
                      local_ac = local_15c;
                      local_b0 = local_c4;
                      local_b4 = local_b8;
                    }
                  }
                }
              }
            }
            if ((local_b0 != -1) && (local_b4 != -1)) {
              lVar14 = *(long *)(in_RSI + 0xe) * (long)(iVar10 + local_b4);
              iVar9 = iVar9 + local_b0;
              if (*in_RSI == 0) {
                *(float *)((long)local_50 + (long)iVar9 * 4 + lVar14) =
                     fVar16 + *(float *)((long)local_50 + (long)iVar9 * 4 + lVar14);
              }
              else {
                fVar15 = ggml_lookup_fp16_to_fp32
                                   (*(ggml_fp16_t *)((long)local_50 + (long)iVar9 * 2 + lVar14));
                auVar17._0_12_ = ZEXT812(0);
                auVar17._12_4_ = 0;
                auVar17 = vblendps_avx(auVar17,ZEXT416((uint)(fVar16 + fVar15)),1);
                auVar17 = vcvtps2ph_f16c(auVar17,0);
                *(short *)((long)local_50 + (long)iVar9 * 2 + lVar14) = auVar17._0_2_;
              }
            }
          }
          else if (iVar1 == 1) {
            fVar16 = fVar16 / (float)(iVar2 * iVar3);
            for (local_110 = 0; local_110 < iVar3; local_110 = local_110 + 1) {
              if ((-1 < iVar10 + local_110) && ((long)(iVar10 + local_110) < *(long *)(in_RSI + 6)))
              {
                lVar14 = *(long *)(in_RSI + 0xe) * (long)(iVar10 + local_110);
                for (local_11c = 0; local_11c < iVar2; local_11c = local_11c + 1) {
                  iVar11 = iVar9 + local_11c;
                  if ((-1 < iVar11) && ((long)iVar11 < *(long *)(in_RSI + 4))) {
                    if (*in_RSI == 0) {
                      *(float *)((long)local_50 + (long)iVar11 * 4 + lVar14) =
                           fVar16 + *(float *)((long)local_50 + (long)iVar11 * 4 + lVar14);
                    }
                    else {
                      auVar17 = vcvtps2ph_f16c(ZEXT416((uint)fVar16),0);
                      *(short *)((long)local_50 + (long)iVar11 * 2 + lVar14) =
                           *(short *)((long)local_50 + (long)iVar11 * 2 + lVar14) + auVar17._0_2_;
                    }
                  }
                }
              }
            }
          }
          else {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                       ,0x195f,"GGML_ASSERT(%s) failed","false");
          }
        }
      }
      local_58 = *(long *)(in_RSI + 0x10) + local_58;
      local_80 = lVar12 * lVar8 * 4 + local_80;
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pool_2d_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src  = dst->src[0];
    const ggml_tensor * dstf = dst->src[1]; // forward tensor of dst

    assert(dst->type == GGML_TYPE_F32 || dst->type == GGML_TYPE_F16);

    if (params->ith != 0) {
        return;
    }

    const int32_t * opts = (const int32_t *)dst->op_params;
    ggml_op_pool op = static_cast<ggml_op_pool>(opts[0]);
    const int k0 = opts[1];
    const int k1 = opts[2];
    const int s0 = opts[3];
    const int s1 = opts[4];
    const int p0 = opts[5];
    const int p1 = opts[6];

    char       * cdata  = (char       *) dst->data;
    const char * cdataf = (const char *) dstf->data;
    const char * const data_end = cdata + ggml_nbytes(dst);

    GGML_ASSERT(params->ith == 0);
    memset(cdata, 0, ggml_nbytes(dst));

    const int64_t px = src->ne[0];
    const int64_t py = src->ne[1];
    const int64_t pa = px * py;

    const float * splane = (const float *) src->data;

    const int ka = k0 * k1;
    const int offset0 = -p0;
    const int offset1 = -p1;

    while (cdata < data_end) {
        for (int oy = 0; oy < py; ++oy) {
            const float * const srow = splane + oy * px;
            for (int ox = 0; ox < px; ++ox) {
                const float grad0 = srow[ox];

                const int ix = offset0 + ox * s0;
                const int iy = offset1 + oy * s1;

                if (op == GGML_OP_POOL_MAX) {
                    float maxval = -FLT_MAX;
                    int kxmax = -1;
                    int kymax = -1;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        const void * drowf = (const void *)(cdataf + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            const float val = dst->type == GGML_TYPE_F32 ?
                                ((const float *) drowf)[j] : GGML_FP16_TO_FP32(((const ggml_fp16_t *) drowf)[j]);
                            if (val <= maxval) {
                                continue;
                            }

                            maxval = val;
                            kxmax = kx;
                            kymax = ky;
                        }
                    }

                    if (kxmax == -1 || kymax == -1) {
                        continue;
                    }

                    void * drow = (void *)(cdata + dst->nb[1] * (iy + kymax));
                    const int j = ix + kxmax;
                    if (dst->type == GGML_TYPE_F32) {
                        ((float *) drow)[j] += grad0;
                    } else {
                        ((ggml_fp16_t *) drow)[j] = GGML_FP32_TO_FP16(grad0 + GGML_FP16_TO_FP32(((const ggml_fp16_t *) drow)[j]));
                    }
                } else if (op == GGML_OP_POOL_AVG) {
                    const float grad = grad0 / ka;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        void * drow = (void *)(cdata + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            if (dst->type == GGML_TYPE_F32) {
                                ((float *) drow)[j] += grad;
                            } else {
                                ((ggml_fp16_t *) drow)[j] += GGML_FP32_TO_FP16(grad);
                            }
                        }
                    }
                } else {
                    GGML_ASSERT(false);
                }
            }
        }

        cdata  += dst->nb[2];
        cdataf += dst->nb[2];
        splane += pa;
    }
}